

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_melt_rock(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  OBJ_DATA *unaff_R12;
  uint iWear;
  
  act("A wave of oppressive heat emanates from your fingertips as you gesture at $N.",ch,(void *)0x0
      ,vo,3);
  act("As $n gestures, a wave of oppressive heat washes over you.",ch,(void *)0x0,vo,2);
  act("$n gestures, sending a wave of oppressive heat washing over $N.",ch,(void *)0x0,vo,1);
  for (iWear = 0; iWear != 0x16; iWear = iWear + 1) {
    unaff_R12 = get_eq_char((CHAR_DATA *)vo,iWear);
    if (((((iWear & 0x1d) != 0x10 && unaff_R12 != (OBJ_DATA *)0x0) &&
         (bVar2 = is_obj_stat(unaff_R12,0x18), !bVar2)) && (bVar2 = is_stone(unaff_R12), bVar2)) &&
       (iVar3 = number_range(0,100), iVar3 <= (short)(ch->level / 2 + 0x28))) {
      act("$p melts under the intense heat, scorching you!",ch,unaff_R12,vo,2);
      act("$p melts under the intense heat, scorching $m!",ch,unaff_R12,vo,3);
      act("$p melts under the intense heat, scorching $m!",ch,unaff_R12,vo,1);
      iVar3 = dice((int)unaff_R12->level,2);
      damage_new(ch,(CHAR_DATA *)vo,iVar3 / 2,sn,1,true,false,0,1,"The molten rock*");
      extract_obj(unaff_R12);
    }
  }
  iVar3 = skill_lookup("stoneskin");
  bVar2 = is_affected((CHAR_DATA *)vo,iVar3);
  if (bVar2) {
    sVar1 = ch->level;
    iVar3 = skill_lookup("stoneskin");
    bVar2 = check_dispel(sVar1 + 3,(CHAR_DATA *)vo,iVar3);
    if (bVar2) {
      act("Your stoneskin melts under the intense heat, scorching you!",ch,unaff_R12,vo,2);
      act("$N\'s stoneskin melts under the intense heat, scorching $m!",ch,unaff_R12,vo,3);
      act("$N\'s stoneskin melts under the intense heat, scorching $m!",ch,unaff_R12,vo,1);
      iVar3 = dice((int)ch->level,10);
      damage_new(ch,(CHAR_DATA *)vo,iVar3,sn,1,true,false,0,1,"The molten rock*");
    }
  }
  return;
}

Assistant:

void spell_melt_rock(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	int iWear, dam;

	act("A wave of oppressive heat emanates from your fingertips as you gesture at $N.", ch, 0, victim, TO_CHAR);
	act("As $n gestures, a wave of oppressive heat washes over you.", ch, 0, victim, TO_VICT);
	act("$n gestures, sending a wave of oppressive heat washing over $N.", ch, 0, victim, TO_NOTVICT);

	for (iWear = 0; iWear < MAX_WEAR; iWear++)
	{
		obj = get_eq_char(victim, iWear);

		if (obj == nullptr || iWear == WEAR_WIELD || iWear == WEAR_DUAL_WIELD)
			continue;

		if (is_obj_stat(obj, ITEM_BURN_PROOF))
			continue;

		if (!is_stone(obj))
			continue;

		if (number_range(0, 100) > (40 + (ch->level / 2)))
			continue;

		act("$p melts under the intense heat, scorching you!", ch, obj, victim, TO_VICT);
		act("$p melts under the intense heat, scorching $m!", ch, obj, victim, TO_CHAR);
		act("$p melts under the intense heat, scorching $m!", ch, obj, victim, TO_NOTVICT);

		dam = dice(obj->level, 2) / 2;

		damage_new(ch, victim, dam, sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "The molten rock*");
		extract_obj(obj);
	}

	if (is_affected(victim, skill_lookup("stoneskin")))
	{
		if (check_dispel(ch->level + 3, victim, skill_lookup("stoneskin")))
		{
			act("Your stoneskin melts under the intense heat, scorching you!", ch, obj, victim, TO_VICT);
			act("$N's stoneskin melts under the intense heat, scorching $m!", ch, obj, victim, TO_CHAR);
			act("$N's stoneskin melts under the intense heat, scorching $m!", ch, obj, victim, TO_NOTVICT);

			damage_new(ch, victim, dice(ch->level, 10), sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "The molten rock*");
		}
	}
}